

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::UpdateWitnessStackTxInRequest::ConvertFromStruct
          (UpdateWitnessStackTxInRequest *this,UpdateWitnessStackTxInRequestStruct *data)

{
  UpdateWitnessStackTxInRequestStruct *data_local;
  UpdateWitnessStackTxInRequest *this_local;
  
  std::__cxx11::string::operator=((string *)&this->txid_,(string *)data);
  this->vout_ = data->vout;
  WitnessStackData::ConvertFromStruct(&this->witness_stack_,&data->witness_stack);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void UpdateWitnessStackTxInRequest::ConvertFromStruct(
    const UpdateWitnessStackTxInRequestStruct& data) {
  txid_ = data.txid;
  vout_ = data.vout;
  witness_stack_.ConvertFromStruct(data.witness_stack);
  ignore_items = data.ignore_items;
}